

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void CreateDefaultClassAssignment
               (ExpressionContext *ctx,SynBase *source,ExprClassDefinition *classDefinition)

{
  Allocator *allocator;
  ScopeData *scope;
  TypeBase *pTVar1;
  IntrusiveList<TypeHandle> generics;
  IntrusiveList<TypeHandle> generics_00;
  IntrusiveList<ExprVariableDefinition> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  ArrayView<ArgumentData> arguments_02;
  IntrusiveList<ExprBase> expressions_00;
  IntrusiveList<MatchData> generics_01;
  InplaceStr name;
  bool bVar2;
  uint uVar3;
  TypeRef *pTVar4;
  bool_type bVar5;
  VariableHandle *pVVar6;
  SynIdentifier *pSVar7;
  FunctionData *pFVar8;
  TypeFunction *type_00;
  SmallArray<ArgumentData,_4U> *this;
  ArgumentData *val;
  SynBase *source_00;
  ExprBase *pEVar9;
  ExprVariableDefinition *pEVar10;
  ExprBase *pEVar11;
  ExprReturn *this_00;
  ExprFunctionDefinition *this_01;
  char *pcVar12;
  ArrayView<FunctionValue> functions_00;
  ArrayView<FunctionValue> functions_01;
  ArrayView<ArgumentData> arguments_03;
  InplaceStr name_00;
  ArrayView<ArgumentData> arguments_04;
  ExprBase *rightMember;
  ExprBase *right;
  VariableData *rightArgument;
  ExprBase *leftMember;
  ExprBase *left;
  VariableData *leftArgument;
  MemberHandle *curr_1;
  IntrusiveList<ExprBase> expressions;
  ExprVariableDefinition *contextArgumentDefinition;
  undefined4 local_b00;
  undefined1 auStack_af8 [8];
  IntrusiveList<ExprVariableDefinition> variables;
  uint local_ad4;
  undefined1 auStack_ad0 [4];
  uint i;
  MatchData *pMStack_ac8;
  undefined1 local_ac0 [12];
  FunctionData *local_ab0;
  FunctionData *function;
  char *pcStack_aa0;
  SynIdentifier *local_a90;
  SynIdentifier *functionNameIdentifier;
  ArgumentData local_a78;
  InplaceStr local_a48;
  ArgumentData local_a38;
  undefined1 local_a08 [8];
  SmallArray<ArgumentData,_2U> arguments_1;
  InplaceStr functionName;
  undefined8 uStack_978;
  IntrusiveList<TypeHandle> local_970;
  undefined1 local_960 [12];
  undefined1 local_950 [8];
  FunctionValue bestOverload_1;
  SmallArray<unsigned_int,_32U> ratings_1;
  SmallArray<FunctionValue,_32U> functions_1;
  IntrusiveList<SynIdentifier> local_578;
  ExprBase *local_568;
  ExprBase *overloads_1;
  ArrayView<ArgumentData> local_558;
  IntrusiveList<TypeHandle> local_548;
  undefined1 local_538 [12];
  undefined1 local_528 [8];
  FunctionValue bestOverload;
  SmallArray<unsigned_int,_32U> ratings;
  SmallArray<FunctionValue,_32U> functions;
  IntrusiveList<SynIdentifier> local_150;
  ExprBase *local_140;
  ExprBase *overloads;
  ArgumentData local_f8;
  undefined1 local_c8 [8];
  SmallArray<ArgumentData,_2U> arguments;
  TypeBase *type;
  MemberHandle *curr;
  IntrusiveList<VariableHandle> customAssignMembers;
  TypeClass *classType;
  ExprClassDefinition *classDefinition_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  ExpressionContext::PopScope(ctx,SCOPE_TYPE);
  customAssignMembers.tail = (VariableHandle *)classDefinition->classType;
  IntrusiveList<VariableHandle>::IntrusiveList((IntrusiveList<VariableHandle> *)&curr);
  type = (TypeBase *)customAssignMembers.tail[3].variable;
  do {
    if (type == (TypeBase *)0x0) {
      bVar2 = IntrusiveList<VariableHandle>::empty((IntrusiveList<VariableHandle> *)&curr);
      if (!bVar2) {
        InplaceStr::InplaceStr((InplaceStr *)&arguments_1.allocator,"default_assign$_");
        SmallArray<ArgumentData,_2U>::SmallArray
                  ((SmallArray<ArgumentData,_2U> *)local_a08,ctx->allocator);
        pSVar7 = ExpressionContext::get<SynIdentifier>(ctx);
        InplaceStr::InplaceStr(&local_a48,"$left");
        SynIdentifier::SynIdentifier(pSVar7,local_a48);
        pTVar4 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)customAssignMembers.tail);
        ArgumentData::ArgumentData
                  (&local_a38,source,false,pSVar7,&pTVar4->super_TypeBase,(ExprBase *)0x0);
        SmallArray<ArgumentData,_2U>::push_back
                  ((SmallArray<ArgumentData,_2U> *)local_a08,&local_a38);
        pSVar7 = ExpressionContext::get<SynIdentifier>(ctx);
        InplaceStr::InplaceStr((InplaceStr *)&functionNameIdentifier,"$right");
        SynIdentifier::SynIdentifier(pSVar7,_functionNameIdentifier);
        ArgumentData::ArgumentData
                  (&local_a78,source,false,pSVar7,(TypeBase *)customAssignMembers.tail,
                   (ExprBase *)0x0);
        SmallArray<ArgumentData,_2U>::push_back
                  ((SmallArray<ArgumentData,_2U> *)local_a08,&local_a78);
        pSVar7 = ExpressionContext::get<SynIdentifier>(ctx);
        function = (FunctionData *)arguments_1.allocator;
        pcStack_aa0 = functionName.begin;
        name.end = functionName.begin;
        name.begin = (char *)arguments_1.allocator;
        SynIdentifier::SynIdentifier(pSVar7,name);
        local_a90 = pSVar7;
        pFVar8 = ExpressionContext::get<FunctionData>(ctx);
        allocator = ctx->allocator;
        scope = ctx->scope;
        pTVar1 = ctx->typeVoid;
        ArrayView<ArgumentData>::ArrayView<2u>
                  ((ArrayView<ArgumentData> *)local_ac0,(SmallArray<ArgumentData,_2U> *)local_a08);
        arguments_03._12_4_ = 0;
        arguments_03.data = (ArgumentData *)local_ac0._0_8_;
        arguments_03.count = local_ac0._8_4_;
        type_00 = ExpressionContext::GetFunctionType(ctx,source,pTVar1,arguments_03);
        pTVar4 = ExpressionContext::GetReferenceType(ctx,ctx->typeVoid);
        pSVar7 = local_a90;
        IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)auStack_ad0);
        uVar3 = ctx->uniqueFunctionId;
        ctx->uniqueFunctionId = uVar3 + 1;
        pcVar12 = (char *)0x0;
        generics_01.tail = pMStack_ac8;
        generics_01.head = _auStack_ad0;
        FunctionData::FunctionData
                  (pFVar8,allocator,source,scope,false,false,false,type_00,&pTVar4->super_TypeBase,
                   pSVar7,generics_01,uVar3);
        customAssignMembers.tail[9].variable = (VariableData *)pFVar8;
        local_ab0 = pFVar8;
        for (local_ad4 = 0;
            uVar3 = SmallArray<ArgumentData,_2U>::size((SmallArray<ArgumentData,_2U> *)local_a08),
            local_ad4 < uVar3; local_ad4 = local_ad4 + 1) {
          this = &local_ab0->arguments;
          val = SmallArray<ArgumentData,_2U>::operator[]
                          ((SmallArray<ArgumentData,_2U> *)local_a08,local_ad4);
          SmallArray<ArgumentData,_4U>::push_back(this,val);
        }
        variables.tail = (ExprVariableDefinition *)(local_ab0->name->name).begin;
        name_00.end = pcVar12;
        name_00.begin = (local_ab0->name->name).end;
        anon_unknown.dwarf_e7629::CheckFunctionConflict
                  ((anon_unknown_dwarf_e7629 *)ctx,(ExpressionContext *)source,
                   (SynBase *)variables.tail,name_00);
        ExpressionContext::AddFunction(ctx,local_ab0);
        ExpressionContext::PushScope(ctx,local_ab0);
        local_ab0->functionScope = ctx->scope;
        IntrusiveList<ExprVariableDefinition>::IntrusiveList
                  ((IntrusiveList<ExprVariableDefinition> *)auStack_af8);
        pFVar8 = local_ab0;
        ArrayView<ArgumentData>::ArrayView<2u>
                  ((ArrayView<ArgumentData> *)&contextArgumentDefinition,
                   (SmallArray<ArgumentData,_2U> *)local_a08);
        arguments_04._12_4_ = 0;
        arguments_04.data = (ArgumentData *)contextArgumentDefinition;
        arguments_04.count = local_b00;
        CreateFunctionArgumentVariables
                  (ctx,source,pFVar8,arguments_04,
                   (IntrusiveList<ExprVariableDefinition> *)auStack_af8);
        source_00 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
        expressions.tail = &CreateFunctionContextArgument(ctx,source_00,local_ab0)->super_ExprBase;
        local_ab0->argumentsSize = local_ab0->functionScope->dataSize;
        IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&curr_1);
        for (leftArgument = customAssignMembers.tail[3].variable;
            leftArgument != (VariableData *)0x0;
            leftArgument = *(VariableData **)&leftArgument->alignment) {
          pEVar9 = CreateVariableAccess
                             (ctx,source,(*(VariableHandle **)((long)auStack_af8 + 0x30))->variable,
                              false);
          pEVar9 = CreateMemberAccess(ctx,source,pEVar9,
                                      (SynIdentifier *)leftArgument->importModule->lexer,false);
          pEVar10 = getType<ExprVariableDefinition>(((ExprBase *)auStack_af8)->next);
          pEVar11 = CreateVariableAccess(ctx,source,pEVar10->variable->variable,false);
          pEVar11 = CreateMemberAccess(ctx,source,pEVar11,
                                       (SynIdentifier *)leftArgument->importModule->lexer,false);
          pEVar9 = CreateAssignment(ctx,source,pEVar9,pEVar11);
          IntrusiveList<ExprBase>::push_back((IntrusiveList<ExprBase> *)&curr_1,pEVar9);
        }
        this_00 = ExpressionContext::get<ExprReturn>(ctx);
        pTVar1 = ctx->typeVoid;
        pEVar9 = &ExpressionContext::get<ExprVoid>(ctx)->super_ExprBase;
        ExprVoid::ExprVoid((ExprVoid *)pEVar9,source,ctx->typeVoid);
        ExprReturn::ExprReturn(this_00,source,pTVar1,pEVar9,(ExprBase *)0x0,(ExprBase *)0x0);
        IntrusiveList<ExprBase>::push_back
                  ((IntrusiveList<ExprBase> *)&curr_1,&this_00->super_ExprBase);
        ClosePendingUpvalues(ctx,local_ab0);
        ExpressionContext::PopScope(ctx,SCOPE_FUNCTION);
        this_01 = ExpressionContext::get<ExprFunctionDefinition>(ctx);
        arguments_00.tail = variables.head;
        arguments_00.head = (ExprVariableDefinition *)auStack_af8;
        expressions_00.tail = expressions.head;
        expressions_00.head = (ExprBase *)curr_1;
        ExprFunctionDefinition::ExprFunctionDefinition
                  (this_01,source,&local_ab0->type->super_TypeBase,local_ab0,
                   (ExprVariableDefinition *)expressions.tail,arguments_00,(ExprBase *)0x0,
                   expressions_00,(ExprVariableDefinition *)0x0,(VariableData *)0x0);
        local_ab0->declaration = &this_01->super_ExprBase;
        SmallArray<ExprBase_*,_128U>::push_back(&ctx->definitions,&local_ab0->declaration);
        IntrusiveList<ExprBase>::push_back(&classDefinition->functions,local_ab0->declaration);
        SmallArray<ArgumentData,_2U>::~SmallArray((SmallArray<ArgumentData,_2U> *)local_a08);
      }
      RestoreParentTypeScope(ctx,source,(TypeBase *)classDefinition->classType);
      return;
    }
    arguments.allocator = *(Allocator **)(*(long *)&type->typeID + 0x20);
    bVar2 = isType<TypeRef>((TypeBase *)arguments.allocator);
    if ((((!bVar2) && (bVar2 = isType<TypeArray>((TypeBase *)arguments.allocator), !bVar2)) &&
        (bVar2 = isType<TypeUnsizedArray>((TypeBase *)arguments.allocator), !bVar2)) &&
       ((bVar2 = isType<TypeFunction>((TypeBase *)arguments.allocator), !bVar2 &&
        (bVar2 = isType<TypeError>((TypeBase *)arguments.allocator), !bVar2)))) {
      SmallArray<ArgumentData,_2U>::SmallArray
                ((SmallArray<ArgumentData,_2U> *)local_c8,ctx->allocator);
      pTVar4 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)arguments.allocator);
      ArgumentData::ArgumentData
                (&local_f8,source,false,(SynIdentifier *)0x0,&pTVar4->super_TypeBase,(ExprBase *)0x0
                );
      SmallArray<ArgumentData,_2U>::push_back((SmallArray<ArgumentData,_2U> *)local_c8,&local_f8);
      ArgumentData::ArgumentData
                ((ArgumentData *)&overloads,source,false,(SynIdentifier *)0x0,
                 (TypeBase *)arguments.allocator,(ExprBase *)0x0);
      SmallArray<ArgumentData,_2U>::push_back
                ((SmallArray<ArgumentData,_2U> *)local_c8,(ArgumentData *)&overloads);
      IntrusiveList<SynIdentifier>::IntrusiveList(&local_150);
      InplaceStr::InplaceStr((InplaceStr *)&functions.allocator,"=");
      local_140 = CreateVariableAccess(ctx,source,local_150,stack0xfffffffffffffea0,false);
      if (local_140 == (ExprBase *)0x0) {
LAB_00258b75:
        IntrusiveList<SynIdentifier>::IntrusiveList(&local_578);
        InplaceStr::InplaceStr((InplaceStr *)&functions_1.allocator,"default_assign$_");
        local_568 = CreateVariableAccess(ctx,source,local_578,stack0xfffffffffffffa78,false);
        if (local_568 != (ExprBase *)0x0) {
          SmallArray<FunctionValue,_32U>::SmallArray
                    ((SmallArray<FunctionValue,_32U> *)&ratings_1.allocator,ctx->allocator);
          GetNodeFunctions(ctx,source,local_568,
                           (SmallArray<FunctionValue,_32U> *)&ratings_1.allocator);
          bVar2 = SmallArray<FunctionValue,_32U>::empty
                            ((SmallArray<FunctionValue,_32U> *)&ratings_1.allocator);
          if (bVar2) {
LAB_00258dd8:
            overloads_1._4_4_ = 0;
          }
          else {
            SmallArray<unsigned_int,_32U>::SmallArray
                      ((SmallArray<unsigned_int,_32U> *)&bestOverload_1.context,ctx->allocator);
            ArrayView<FunctionValue>::ArrayView<32u>
                      ((ArrayView<FunctionValue> *)local_960,
                       (SmallArray<FunctionValue,_32U> *)&ratings_1.allocator);
            IntrusiveList<TypeHandle>::IntrusiveList(&local_970);
            ArrayView<ArgumentData>::ArrayView<2u>
                      ((ArrayView<ArgumentData> *)&functionName.end,
                       (SmallArray<ArgumentData,_2U> *)local_c8);
            generics_00.tail = local_970.tail;
            generics_00.head = local_970.head;
            arguments_02._8_8_ = uStack_978;
            arguments_02.data = (ArgumentData *)functionName.end;
            functions_01._12_4_ = 0;
            functions_01.data = (FunctionValue *)local_960._0_8_;
            functions_01.count = local_960._8_4_;
            SelectBestFunction((FunctionValue *)local_950,ctx,source,functions_01,generics_00,
                               arguments_02,(SmallArray<unsigned_int,_32U> *)&bestOverload_1.context
                              );
            bVar5 = FunctionValue::operator_cast_to_function_pointer((FunctionValue *)local_950);
            if (bVar5 == 0) {
              overloads_1._4_4_ = 0;
            }
            else {
              pVVar6 = ExpressionContext::get<VariableHandle>(ctx);
              VariableHandle::VariableHandle
                        (pVVar6,(SynBase *)type->_vptr_TypeBase,*(VariableData **)&type->typeID);
              IntrusiveList<VariableHandle>::push_back
                        ((IntrusiveList<VariableHandle> *)&curr,pVVar6);
              overloads_1._4_4_ = 4;
            }
            SmallArray<unsigned_int,_32U>::~SmallArray
                      ((SmallArray<unsigned_int,_32U> *)&bestOverload_1.context);
            if (overloads_1._4_4_ == 0) goto LAB_00258dd8;
          }
          SmallArray<FunctionValue,_32U>::~SmallArray
                    ((SmallArray<FunctionValue,_32U> *)&ratings_1.allocator);
          if (overloads_1._4_4_ != 0) goto LAB_00258e14;
        }
        overloads_1._4_4_ = 0;
      }
      else {
        SmallArray<FunctionValue,_32U>::SmallArray
                  ((SmallArray<FunctionValue,_32U> *)&ratings.allocator,ctx->allocator);
        GetNodeFunctions(ctx,source,local_140,(SmallArray<FunctionValue,_32U> *)&ratings.allocator);
        bVar2 = SmallArray<FunctionValue,_32U>::empty
                          ((SmallArray<FunctionValue,_32U> *)&ratings.allocator);
        if (bVar2) {
LAB_00258b3c:
          overloads_1._4_4_ = 0;
        }
        else {
          SmallArray<unsigned_int,_32U>::SmallArray
                    ((SmallArray<unsigned_int,_32U> *)&bestOverload.context,ctx->allocator);
          ArrayView<FunctionValue>::ArrayView<32u>
                    ((ArrayView<FunctionValue> *)local_538,
                     (SmallArray<FunctionValue,_32U> *)&ratings.allocator);
          IntrusiveList<TypeHandle>::IntrusiveList(&local_548);
          ArrayView<ArgumentData>::ArrayView<2u>
                    (&local_558,(SmallArray<ArgumentData,_2U> *)local_c8);
          generics.tail = local_548.tail;
          generics.head = local_548.head;
          arguments_01.count = local_558.count;
          arguments_01._12_4_ = local_558._12_4_;
          arguments_01.data = local_558.data;
          functions_00._12_4_ = 0;
          functions_00.data = (FunctionValue *)local_538._0_8_;
          functions_00.count = local_538._8_4_;
          SelectBestFunction((FunctionValue *)local_528,ctx,source,functions_00,generics,
                             arguments_01,(SmallArray<unsigned_int,_32U> *)&bestOverload.context);
          bVar5 = FunctionValue::operator_cast_to_function_pointer((FunctionValue *)local_528);
          if (bVar5 == 0) {
            overloads_1._4_4_ = 0;
          }
          else {
            pVVar6 = ExpressionContext::get<VariableHandle>(ctx);
            VariableHandle::VariableHandle
                      (pVVar6,(SynBase *)type->_vptr_TypeBase,*(VariableData **)&type->typeID);
            IntrusiveList<VariableHandle>::push_back((IntrusiveList<VariableHandle> *)&curr,pVVar6);
            overloads_1._4_4_ = 4;
          }
          SmallArray<unsigned_int,_32U>::~SmallArray
                    ((SmallArray<unsigned_int,_32U> *)&bestOverload.context);
          if (overloads_1._4_4_ == 0) goto LAB_00258b3c;
        }
        SmallArray<FunctionValue,_32U>::~SmallArray
                  ((SmallArray<FunctionValue,_32U> *)&ratings.allocator);
        if (overloads_1._4_4_ == 0) goto LAB_00258b75;
      }
LAB_00258e14:
      SmallArray<ArgumentData,_2U>::~SmallArray((SmallArray<ArgumentData,_2U> *)local_c8);
    }
    type = (TypeBase *)(type->name).end;
  } while( true );
}

Assistant:

void CreateDefaultClassAssignment(ExpressionContext &ctx, SynBase *source, ExprClassDefinition *classDefinition)
{
	ctx.PopScope(SCOPE_TYPE);

	TypeClass *classType = classDefinition->classType;

	IntrusiveList<VariableHandle> customAssignMembers;

	for(MemberHandle *curr = classType->members.head; curr; curr = curr->next)
	{
		TypeBase *type = curr->variable->type;

		if(isType<TypeRef>(type) || isType<TypeArray>(type) || isType<TypeUnsizedArray>(type) || isType<TypeFunction>(type) || isType<TypeError>(type))
			continue;

		SmallArray<ArgumentData, 2> arguments(ctx.allocator);

		arguments.push_back(ArgumentData(source, false, NULL, ctx.GetReferenceType(type), NULL));
		arguments.push_back(ArgumentData(source, false, NULL, type, NULL));

		if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), InplaceStr("="), false))
		{
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			GetNodeFunctions(ctx, source, overloads, functions);

			if(!functions.empty())
			{
				SmallArray<unsigned, 32> ratings(ctx.allocator);

				FunctionValue bestOverload = SelectBestFunction(ctx, source, functions, IntrusiveList<TypeHandle>(), arguments, ratings);

				if(bestOverload)
				{
					customAssignMembers.push_back(new (ctx.get<VariableHandle>()) VariableHandle(curr->source, curr->variable));
					continue;
				}
			}
		}

		if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), InplaceStr("default_assign$_"), false))
		{
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			GetNodeFunctions(ctx, source, overloads, functions);

			if(!functions.empty())
			{
				SmallArray<unsigned, 32> ratings(ctx.allocator);

				FunctionValue bestOverload = SelectBestFunction(ctx, source, functions, IntrusiveList<TypeHandle>(), arguments, ratings);

				if(bestOverload)
				{
					customAssignMembers.push_back(new (ctx.get<VariableHandle>()) VariableHandle(curr->source, curr->variable));
					continue;
				}
			}
		}
	}

	if(!customAssignMembers.empty())
	{
		InplaceStr functionName = InplaceStr("default_assign$_");

		SmallArray<ArgumentData, 2> arguments(ctx.allocator);

		arguments.push_back(ArgumentData(source, false, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$left")), ctx.GetReferenceType(classType), NULL));
		arguments.push_back(ArgumentData(source, false, new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$right")), classType, NULL));

		SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(functionName);

		FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, source, ctx.scope, false, false, false, ctx.GetFunctionType(source, ctx.typeVoid, arguments), ctx.GetReferenceType(ctx.typeVoid), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

		classType->defaultAssign = function;

		// Fill in argument data
		for(unsigned i = 0; i < arguments.size(); i++)
			function->arguments.push_back(arguments[i]);

		CheckFunctionConflict(ctx, source, function->name->name);

		ctx.AddFunction(function);

		ctx.PushScope(function);

		function->functionScope = ctx.scope;

		IntrusiveList<ExprVariableDefinition> variables;

		CreateFunctionArgumentVariables(ctx, source, function, arguments, variables);

		ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(source), function);

		function->argumentsSize = function->functionScope->dataSize;

		IntrusiveList<ExprBase> expressions;

		for(MemberHandle *curr = classType->members.head; curr; curr = curr->next)
		{
			VariableData *leftArgument = variables.head->variable->variable;

			ExprBase *left = CreateVariableAccess(ctx, source, leftArgument, false);

			ExprBase *leftMember = CreateMemberAccess(ctx, source, left, curr->variable->name, false);

			VariableData *rightArgument = getType<ExprVariableDefinition>(variables.head->next)->variable->variable;

			ExprBase *right = CreateVariableAccess(ctx, source, rightArgument, false);

			ExprBase *rightMember = CreateMemberAccess(ctx, source, right, curr->variable->name, false);

			expressions.push_back(CreateAssignment(ctx, source, leftMember, rightMember));
		}

		expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(source, ctx.typeVoid, new (ctx.get<ExprVoid>()) ExprVoid(source, ctx.typeVoid), NULL, NULL));

		ClosePendingUpvalues(ctx, function);

		ctx.PopScope(SCOPE_FUNCTION);

		function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(source, function->type, function, contextArgumentDefinition, variables, NULL, expressions, NULL, NULL);

		ctx.definitions.push_back(function->declaration);

		classDefinition->functions.push_back(function->declaration);
	}

	RestoreParentTypeScope(ctx, source, classDefinition->classType);
}